

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInter.c
# Opt level: O2

int Int_ManGlobalVars(Int_Man_t *p)

{
  Sto_Man_t *pSVar1;
  uint uVar2;
  Sto_Cls_t *pSVar3;
  int iVar4;
  long lVar5;
  Sto_Cls_t *pSVar6;
  ulong uVar7;
  
  pSVar1 = p->pCnf;
  pSVar6 = (Sto_Cls_t *)&pSVar1->pHead;
  pSVar3 = pSVar6;
  while (pSVar3 = pSVar3->pNext, pSVar3 != (Sto_Cls_t *)0x0) {
    uVar2 = *(uint *)&pSVar3->field_0x1c;
    if ((~uVar2 & 3) != 0) break;
    for (uVar7 = 0; uVar7 < (uVar2 >> 3 & 0xffffff); uVar7 = uVar7 + 1) {
      p->pVarTypes[*(int *)((long)&pSVar3[1].pNext + uVar7 * 4) >> 1] = 1;
      uVar2 = *(uint *)&pSVar3->field_0x1c;
    }
  }
  uVar2 = p->nGloVars;
  if (uVar2 == 0) {
    while (pSVar6 = pSVar6->pNext, pSVar6 != (Sto_Cls_t *)0x0) {
      uVar2 = *(uint *)&pSVar6->field_0x1c;
      if ((uVar2 & 2) == 0) break;
      if ((uVar2 & 1) == 0) {
        for (uVar7 = 0; uVar7 < (uVar2 >> 3 & 0xffffff); uVar7 = uVar7 + 1) {
          iVar4 = *(int *)((long)&pSVar6[1].pNext + uVar7 * 4) >> 1;
          if (p->pVarTypes[iVar4] == 1) {
            p->pVarTypes[iVar4] = -1;
            uVar2 = *(uint *)&pSVar6->field_0x1c;
          }
        }
      }
    }
    uVar2 = 0;
    for (lVar5 = 0; lVar5 < pSVar1->nVars; lVar5 = lVar5 + 1) {
      if (p->pVarTypes[lVar5] == -1) {
        p->pVarTypes[lVar5] = ~uVar2;
        uVar2 = uVar2 + 1;
      }
    }
  }
  else {
    iVar4 = -1;
    for (lVar5 = 0; lVar5 < (int)uVar2; lVar5 = lVar5 + 1) {
      p->pVarTypes[p->pGloVars[lVar5]] = iVar4;
      uVar2 = p->nGloVars;
      iVar4 = iVar4 + -1;
    }
  }
  return uVar2;
}

Assistant:

int Int_ManGlobalVars( Int_Man_t * p )
{
    Sto_Cls_t * pClause;
    int Var, nVarsAB, v;

    // mark the variable encountered in the clauses of A
    Sto_ManForEachClauseRoot( p->pCnf, pClause )
    {
        if ( !pClause->fA )
            break;
        for ( v = 0; v < (int)pClause->nLits; v++ )
            p->pVarTypes[lit_var(pClause->pLits[v])] = 1;
    }

    if ( p->nGloVars )
    {
        for ( v = 0; v < p->nGloVars; v++ )
            p->pVarTypes[ p->pGloVars[v] ] = - v - 1;
        return p->nGloVars;
    }

    // check variables that appear in clauses of B
    nVarsAB = 0;
    Sto_ManForEachClauseRoot( p->pCnf, pClause )
    {
        if ( pClause->fA )
            continue;
        for ( v = 0; v < (int)pClause->nLits; v++ )
        {
            Var = lit_var(pClause->pLits[v]);
            if ( p->pVarTypes[Var] == 1 ) // var of A
            {
                // change it into a global variable
                nVarsAB++;
                p->pVarTypes[Var] = -1;
            }
        }
    }

    // order global variables
    nVarsAB = 0;
    for ( v = 0; v < p->pCnf->nVars; v++ )
        if ( p->pVarTypes[v] == -1 )
            p->pVarTypes[v] -= nVarsAB++;
//printf( "There are %d global variables.\n", nVarsAB );
    return nVarsAB;
}